

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewLogger(PosixEnv *this,string *filename,Logger **result)

{
  int __fd;
  char *__file;
  FILE *pFVar1;
  FILE *fp_00;
  undefined8 *in_RCX;
  undefined8 in_RSI;
  string *in_RDI;
  FILE *fp;
  int fd;
  PosixLogger *in_stack_ffffffffffffffb0;
  int error_number;
  string *context;
  
  error_number = (int)((ulong)in_RSI >> 0x20);
  context = in_RDI;
  __file = (char *)std::__cxx11::string::c_str();
  __fd = open(__file,0x80441,0x1a4);
  if (__fd < 0) {
    *in_RCX = 0;
    __errno_location();
    PosixError(context,error_number);
  }
  else {
    pFVar1 = fdopen(__fd,"w");
    if (pFVar1 == (FILE *)0x0) {
      close(__fd);
      *in_RCX = 0;
      __errno_location();
      PosixError(context,error_number);
    }
    else {
      fp_00 = (FILE *)operator_new(0x10);
      PosixLogger::PosixLogger(in_stack_ffffffffffffffb0,fp_00);
      *in_RCX = fp_00;
      Status::OK();
    }
  }
  return (Status)(char *)in_RDI;
}

Assistant:

Status NewLogger(const std::string& filename, Logger** result) override {
    int fd = ::open(filename.c_str(),
                    O_APPEND | O_WRONLY | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    std::FILE* fp = ::fdopen(fd, "w");
    if (fp == nullptr) {
      ::close(fd);
      *result = nullptr;
      return PosixError(filename, errno);
    } else {
      *result = new PosixLogger(fp);
      return Status::OK();
    }
  }